

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

size_t ConcatBailOutKindBits
                 (char *dst,size_t dstSizeBytes,size_t position,uint enumEntryOffsetFromBitsStart)

{
  BailOutKind BVar1;
  int iVar2;
  char *format;
  int printedBytes;
  char *kindName;
  uint enumEntryOffsetFromBitsStart_local;
  size_t position_local;
  size_t dstSizeBytes_local;
  char *dst_local;
  
  BVar1 = IR::operator+(BailOutKindBitsStart,enumEntryOffsetFromBitsStart);
  format = " | %s";
  if (position == 0) {
    format = "%s";
  }
  iVar2 = sprintf_s(dst + position,dstSizeBytes - position,format,BailOutKindNames[BVar1]);
  return (long)iVar2;
}

Assistant:

size_t ConcatBailOutKindBits(_Out_writes_bytes_(dstSizeBytes) char* dst, _In_ size_t dstSizeBytes, _In_ size_t position, _In_ uint enumEntryOffsetFromBitsStart)
{
    const char* kindName = BailOutKindNames[IR::BailOutKindBitsStart + static_cast<IR::BailOutKind>(enumEntryOffsetFromBitsStart)];
    int printedBytes =
        sprintf_s(
            &dst[position],
            dstSizeBytes - position * sizeof(dst[0]),
            position == 0 ? "%s" : " | %s",
            kindName);
    return printedBytes;
}